

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O3

value_type_conflict7 * __thiscall
poplar::compact_fkhash_nlm<int,_64UL>::append(compact_fkhash_nlm<int,_64UL> *this,char_range *key)

{
  bool bVar1;
  ulong uVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__result;
  char local_3b;
  byte local_3a;
  uchar local_39;
  char_range *local_38;
  
  uVar2 = this->size_;
  this->size_ = uVar2 + 1;
  if ((uVar2 & 0x3f) == 0 && 0x3f < uVar2) {
    release_buf_(this);
  }
  puVar5 = key->end;
  if (key->begin == puVar5) {
    puVar4 = (uint8_t *)0x4;
    puVar5 = (uint8_t *)0x0;
  }
  else {
    uVar2 = ~(ulong)key->begin;
    puVar4 = puVar5 + uVar2 + 4;
    puVar5 = puVar5 + uVar2;
    if ((uint8_t *)0x7f < puVar4) {
      puVar3 = puVar4;
      local_38 = key;
      do {
        local_3a = (byte)puVar3 | 0x80;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&this->chunk_buf_,&local_3a);
        puVar4 = (uint8_t *)((ulong)puVar3 >> 7);
        bVar1 = (uint8_t *)0x3fff < puVar3;
        puVar3 = puVar4;
        key = local_38;
      } while (bVar1);
    }
  }
  __result = &this->chunk_buf_;
  local_39 = (uchar)puVar4;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (__result,&local_39);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (key->begin,puVar5 + (long)key->begin,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             __result);
  lVar6 = 4;
  do {
    local_3b = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<char>
              (__result,&local_3b);
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  return (value_type_conflict7 *)
         ((this->chunk_buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish + -4);
}

Assistant:

value_type* append(const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(size_++);
        if (chunk_id != 0 && pos_in_chunk == 0) {
            release_buf_();
        }

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        uint64_t length = key.empty() ? 0 : key.length() - 1;
        vbyte::append(chunk_buf_, length + sizeof(value_type));
        std::copy(key.begin, key.begin + length, std::back_inserter(chunk_buf_));
        for (size_t i = 0; i < sizeof(value_type); ++i) {
            chunk_buf_.emplace_back('\0');
        }

        return reinterpret_cast<value_type*>(chunk_buf_.data() + chunk_buf_.size() - sizeof(value_type));
    }